

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O0

bool __thiscall
llbuild::core::BuildEngine::attachDB
          (BuildEngine *this,
          unique_ptr<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_> *database
          ,string *error_out)

{
  BuildEngineImpl *this_00;
  bool bVar1;
  unique_ptr<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_> local_28;
  string *local_20;
  string *error_out_local;
  unique_ptr<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_> *database_local;
  BuildEngine *this_local;
  
  this_00 = (BuildEngineImpl *)this->impl;
  local_20 = error_out;
  error_out_local = (string *)database;
  database_local =
       (unique_ptr<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_> *)this;
  std::unique_ptr<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_>::unique_ptr
            (&local_28,database);
  bVar1 = anon_unknown.dwarf_359b51::BuildEngineImpl::attachDB(this_00,&local_28,local_20);
  std::unique_ptr<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_>::~unique_ptr
            (&local_28);
  return bVar1;
}

Assistant:

bool BuildEngine::attachDB(std::unique_ptr<BuildDB> database, std::string* error_out) {
  return static_cast<BuildEngineImpl*>(impl)->attachDB(std::move(database), error_out);
}